

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowAggFinal(Parse *pParse,Window *pMWin,int bFinal)

{
  ExprList *pEVar1;
  FuncDef *pFVar2;
  ExprList *pList;
  Vdbe *p;
  int iVar3;
  int p2;
  Op *pOVar4;
  int op;
  
  p = sqlite3GetVdbe(pParse);
  if (pMWin != (Window *)0x0) {
    do {
      if (((pMWin->pFunc->funcFlags & 0x1000) == 0) || (pMWin->eStart == 'W')) {
        if (pMWin->regApp == 0) {
          pEVar1 = (pMWin->pOwner->x).pList;
          if (bFinal != 0) {
            if (pEVar1 == (ExprList *)0x0) {
              iVar3 = 0;
            }
            else {
              iVar3 = pEVar1->nExpr;
            }
            sqlite3VdbeAddOp3(p,0x9e,pMWin->regAccum,iVar3,0);
            pFVar2 = pMWin->pFunc;
            if (p->db->mallocFailed == '\0') {
              pOVar4 = p->aOp;
              iVar3 = p->nOp;
              pOVar4[(long)iVar3 + -1].p4type = -8;
              pOVar4[(long)iVar3 + -1].p4.pKeyInfo = (KeyInfo *)pFVar2;
            }
            else if ((pFVar2->funcFlags & 0x10) != 0) {
              sqlite3DbFreeNN(p->db,pFVar2);
            }
            sqlite3VdbeAddOp3(p,0x4e,pMWin->regAccum,pMWin->regResult,0);
            p2 = pMWin->regAccum;
            op = 0x49;
            iVar3 = 0;
            goto LAB_0017165c;
          }
          if (pEVar1 == (ExprList *)0x0) {
            iVar3 = 0;
          }
          else {
            iVar3 = pEVar1->nExpr;
          }
          sqlite3VdbeAddOp3(p,0x9d,pMWin->regAccum,iVar3,pMWin->regResult);
          pFVar2 = pMWin->pFunc;
          if (p->db->mallocFailed == '\0') {
            pOVar4 = p->aOp;
            iVar3 = p->nOp;
            pOVar4[(long)iVar3 + -1].p4type = -8;
            pOVar4[(long)iVar3 + -1].p4.pKeyInfo = (KeyInfo *)pFVar2;
          }
          else if ((pFVar2->funcFlags & 0x10) != 0) {
            sqlite3DbFreeNN(p->db,pFVar2);
          }
        }
      }
      else {
        sqlite3VdbeAddOp3(p,0x49,0,pMWin->regResult,0);
        sqlite3VdbeAddOp3(p,0x20,pMWin->csrApp,0,0);
        sqlite3VdbeAddOp3(p,0x5a,pMWin->csrApp,0,pMWin->regResult);
        iVar3 = p->nOp;
        pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          pOVar4 = p->aOp + (int)((iVar3 < 2 | 0xfffffffe) + iVar3);
        }
        pOVar4->p2 = iVar3;
        if (bFinal != 0) {
          iVar3 = pMWin->csrApp;
          op = 0x8b;
          p2 = 0;
LAB_0017165c:
          sqlite3VdbeAddOp3(p,op,iVar3,p2,0);
        }
      }
      pMWin = pMWin->pNextWin;
    } while (pMWin != (Window *)0x0);
  }
  return;
}

Assistant:

static void windowAggFinal(Parse *pParse, Window *pMWin, int bFinal){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( (pWin->pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && pWin->eStart!=TK_UNBOUNDED 
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      if( bFinal ){
        sqlite3VdbeAddOp1(v, OP_ResetSorter, pWin->csrApp);
      }
    }else if( pWin->regApp ){
    }else{
      if( bFinal ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, windowArgCount(pWin));
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue, pWin->regAccum, windowArgCount(pWin),
                             pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
      }
    }
  }
}